

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O1

void __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<true>_>::start_attack
          (fm_operator<ymfm::opn_registers_base<true>_> *this,bool is_restart)

{
  byte bVar1;
  
  if (this->m_env_state != EG_ATTACK) {
    this->m_env_state = EG_ATTACK;
    if (!is_restart) {
      bVar1 = this->m_regs->m_regdata[this->m_opoffs + 0x90];
      this->m_ssg_inverted = bVar1 >> 2 & bVar1 >> 3 & 1;
      this->m_phase = 0;
    }
    if (0x3d < (this->m_cache).eg_rate[1]) {
      this->m_env_attenuation = 0;
    }
  }
  return;
}

Assistant:

void fm_operator<RegisterType>::start_attack(bool is_restart)
{
	// don't change anything if already in attack state
	if (m_env_state == EG_ATTACK)
		return;
	m_env_state = EG_ATTACK;

	// generally not inverted at start, except if SSG-EG is enabled and
	// one of the inverted modes is specified; leave this alone on a
	// restart, as it is managed by the clock_ssg_eg_state() code
	if (RegisterType::EG_HAS_SSG && !is_restart)
		m_ssg_inverted = m_regs.op_ssg_eg_enable(m_opoffs) & bitfield(m_regs.op_ssg_eg_mode(m_opoffs), 2);

	// reset the phase when we start an attack due to a key on
	// (but not when due to an SSG-EG restart except in certain cases
	// managed directly by the SSG-EG code)
	if (!is_restart)
		m_phase = 0;

	// if the attack rate >= 62 then immediately go to max attenuation
	if (m_cache.eg_rate[EG_ATTACK] >= 62)
		m_env_attenuation = 0;
}